

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::IsLazyBailOutCurrentlyNeeeded(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  Sym *pSVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  
  bVar2 = Func::ShouldDoLazyBailOut(this->func);
  if (!bVar2) {
    return false;
  }
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8b2,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar2) goto LAB_003dffbb;
    *puVar4 = 0;
  }
  bVar2 = IR::Instr::HasLazyBailOut(instr);
  if (!bVar2) {
    return false;
  }
  if ((this->currentBlock->field_0x18 & 2) != 0) {
    return false;
  }
  if (this->currentBlock->liveFixedFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8be,"(this->currentBlock->liveFixedFields != nullptr)",
                       "liveFixedField is null, MergeSuccBlocksInfo might have not initialized it?")
    ;
    if (!bVar2) goto LAB_003dffbb;
    *puVar4 = 0;
  }
  bVar2 = IR::Instr::IsStFldVariant(instr);
  if (!bVar2) {
    pBVar6 = this->currentBlock->liveFixedFields;
    do {
      pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head;
      bVar2 = pBVar6 != (BVSparse<Memory::JitArenaAllocator> *)0x0;
      if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return bVar2;
      }
    } while (((Type *)&pBVar6->alloc)->word == 0);
    return bVar2;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8c2,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_003dffbb;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::GetSym(instr->m_dst);
  if (pSVar5->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar2) {
LAB_003dffbb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->currentBlock->liveFixedFields,*(BVIndex *)&pSVar5[1]._vptr_Sym);
  return BVar3 != '\0';
}

Assistant:

bool
BackwardPass::IsLazyBailOutCurrentlyNeeeded(IR::Instr * instr) const
{
    if (!this->func->ShouldDoLazyBailOut())
    {
        return false;
    }

    Assert(this->tag == Js::DeadStorePhase);

    // We insert potential lazy bailout points in the forward pass, so if the instruction doesn't
    // have bailout info at this point, we know for sure lazy bailout is not needed.
    if (!instr->HasLazyBailOut() || this->currentBlock->isDead)
    {
        return false;
    }

    AssertMsg(
        this->currentBlock->liveFixedFields != nullptr,
        "liveFixedField is null, MergeSuccBlocksInfo might have not initialized it?"
    );

    if (instr->IsStFldVariant())
    {
        Assert(instr->GetDst());
        Js::PropertyId id = instr->GetDst()->GetSym()->AsPropertySym()->m_propertyId;

        // We only need to protect against SetFld if it is setting to one of the live fixed fields
        return this->currentBlock->liveFixedFields->Test(id);
    }

    return !this->currentBlock->liveFixedFields->IsEmpty();
}